

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

float Abc_NtkComputeDelay(Abc_Ntk_t *pNtk)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p;
  long *plVar5;
  float *pfVar6;
  int iVar7;
  long lVar8;
  float fVar9;
  float Delays [15];
  
  Delays[0xc] = 0.0;
  Delays[0xd] = 0.0;
  Delays[0xe] = 0.0;
  Delays[8] = 0.0;
  Delays[9] = 0.0;
  Delays[10] = 0.0;
  Delays[0xb] = 0.0;
  Delays[4] = 0.0;
  Delays[5] = 0.0;
  Delays[6] = 0.0;
  Delays[7] = 0.0;
  Delays[0] = 0.0;
  Delays[1] = 0.0;
  Delays[2] = 0.0;
  Delays[3] = 0.0;
  uVar3 = Abc_NtkGetFaninMax(pNtk);
  if (uVar3 - 2 < 0xd) {
    dVar2 = Abc_NtkComputeDelay::GateDelays[uVar3];
    pfVar6 = Delays;
    for (lVar8 = 0; (ulong)uVar3 * 8 + 8 != lVar8; lVar8 = lVar8 + 8) {
      *pfVar6 = (float)(*(double *)((long)Abc_NtkComputeDelay::GateDelays + lVar8) / dVar2);
      pfVar6 = pfVar6 + 1;
    }
    for (iVar7 = 0; iVar7 < pNtk->vCis->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,iVar7);
      (pAVar4->field_6).iTemp = 0;
    }
    p = Abc_NtkDfs(pNtk,1);
    for (iVar7 = 0; iVar7 < p->nSize; iVar7 = iVar7 + 1) {
      plVar5 = (long *)Vec_PtrEntry(p,iVar7);
      *(undefined4 *)(plVar5 + 8) = 0;
      fVar9 = 0.0;
      for (lVar8 = 0; lVar8 < *(int *)((long)plVar5 + 0x1c); lVar8 = lVar8 + 1) {
        fVar1 = *(float *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                    (long)*(int *)(plVar5[4] + lVar8 * 4) * 8) + 0x40);
        if (fVar9 <= fVar1) {
          fVar9 = fVar1;
        }
        *(float *)(plVar5 + 8) = fVar9;
      }
      *(float *)(plVar5 + 8) = fVar9 + Delays[*(int *)((long)plVar5 + 0x1c)];
    }
    Vec_PtrFree(p);
    fVar9 = 0.0;
    for (iVar7 = 0; iVar7 < pNtk->vCos->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = Abc_NtkCo(pNtk,iVar7);
      fVar1 = *(float *)((long)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray] + 0x40);
      if (fVar9 <= fVar1) {
        fVar9 = fVar1;
      }
    }
    return fVar9;
  }
  __assert_fail("nFaninMax > 1 && nFaninMax < 15",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                ,0x9a5,"float Abc_NtkComputeDelay(Abc_Ntk_t *)");
}

Assistant:

float Abc_NtkComputeDelay( Abc_Ntk_t * pNtk )
{
    static double GateDelays[20] = { 1.00, 1.00, 2.00, 2.58, 3.00, 3.32, 3.58, 3.81, 4.00, 4.17, 4.32, 4.46, 4.58, 4.70, 4.81, 4.91, 5.00, 5.09, 5.17, 5.25 };
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin;
    float DelayMax, Delays[15] = {0};
    int nFaninMax, i, k;
    // calculate relative gate delays
    nFaninMax = Abc_NtkGetFaninMax( pNtk );
    assert( nFaninMax > 1 && nFaninMax < 15 );
    for ( i = 0; i <= nFaninMax; i++ )
        Delays[i] = GateDelays[i]/GateDelays[nFaninMax];
    // set max CI delay
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->dTemp = 0.0;
    // compute delays for each node
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        pObj->dTemp = 0.0;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            pObj->dTemp = Abc_MaxFloat( pObj->dTemp, pFanin->dTemp );
        pObj->dTemp += Delays[Abc_ObjFaninNum(pObj)];
    }
    Vec_PtrFree( vNodes );
    DelayMax = 0.0;
    // find max CO delay
    Abc_NtkForEachCo( pNtk, pObj, i )
        DelayMax = Abc_MaxFloat( DelayMax, Abc_ObjFanin0(pObj)->dTemp );
    return DelayMax;
}